

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,Exception *ex)

{
  ostream *poVar1;
  char *pcVar2;
  long *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"[Exception ");
  pcVar2 = (char *)(**(code **)(*in_RSI + 0x10))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, Exception const* ex) {
  stream << "[Exception " << ex->what() << "]";
  return stream;
}